

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void __thiscall duckdb::Executor::InitializeInternal(Executor *this,PhysicalOperator *plan)

{
  pointer prVar1;
  __buckets_ptr __p;
  ClientData *other;
  QueryProfiler *this_00;
  MetaPipeline *pMVar2;
  PhysicalOperator *op;
  PhysicalRecursiveCTE *pPVar3;
  reference_wrapper<duckdb::PhysicalOperator> *rec_cte_ref;
  pointer prVar4;
  shared_ptr<duckdb::MetaPipeline,_true> root_pipeline;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> to_schedule;
  PipelineBuildState state;
  
  TaskScheduler::GetScheduler(this->context);
  ::std::mutex::lock(&this->executor_lock);
  (this->physical_plan).ptr = plan;
  other = ClientData::Get(this->context);
  shared_ptr<duckdb::QueryProfiler,_true>::operator=(&this->profiler,&other->profiler);
  this_00 = shared_ptr<duckdb::QueryProfiler,_true>::operator->(&this->profiler);
  QueryProfiler::Initialize(this_00,plan);
  TaskScheduler::CreateProducer((TaskScheduler *)&state);
  __p = state.delim_join_dependencies._M_h._M_buckets;
  state.delim_join_dependencies._M_h._M_buckets = (__buckets_ptr)0x0;
  ::std::__uniq_ptr_impl<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>::reset
            ((__uniq_ptr_impl<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_> *)
             &this->producer,(pointer)__p);
  ::std::unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>::~unique_ptr
            ((unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_> *)
             &state);
  state.delim_join_dependencies._M_h._M_buckets =
       &state.delim_join_dependencies._M_h._M_single_bucket;
  state.delim_join_dependencies._M_h._M_bucket_count = 1;
  state.delim_join_dependencies._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  state.delim_join_dependencies._M_h._M_element_count = 0;
  state.delim_join_dependencies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  state.delim_join_dependencies._M_h._M_rehash_policy._M_next_resize = 0;
  state.delim_join_dependencies._M_h._M_single_bucket = (__node_base_ptr)0x0;
  state.cte_dependencies._M_h._M_buckets = &state.cte_dependencies._M_h._M_single_bucket;
  state.cte_dependencies._M_h._M_bucket_count = 1;
  state.cte_dependencies._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  state.cte_dependencies._M_h._M_element_count = 0;
  state.cte_dependencies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  state.cte_dependencies._M_h._M_rehash_policy._M_next_resize = 0;
  state.cte_dependencies._M_h._M_single_bucket = (__node_base_ptr)0x0;
  to_schedule.
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  make_shared_ptr<duckdb::MetaPipeline,duckdb::Executor&,duckdb::PipelineBuildState&,decltype(nullptr)>
            ((Executor *)&root_pipeline,(PipelineBuildState *)this,(void **)&state);
  pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&root_pipeline);
  op = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&this->physical_plan);
  MetaPipeline::Build(pMVar2,op);
  pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&root_pipeline);
  MetaPipeline::Ready(pMVar2);
  prVar1 = (this->recursive_ctes).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar4 = (this->recursive_ctes).
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar4 != prVar1; prVar4 = prVar4 + 1) {
    pPVar3 = PhysicalOperator::Cast<duckdb::PhysicalRecursiveCTE>(prVar4->_M_data);
    pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&pPVar3->recursive_meta_pipeline);
    MetaPipeline::Ready(pMVar2);
  }
  pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&root_pipeline);
  MetaPipeline::GetPipelines(pMVar2,&this->root_pipelines,false);
  this->root_pipeline_idx = 0;
  to_schedule.
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_schedule.
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  to_schedule.
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&root_pipeline);
  MetaPipeline::GetMetaPipelines(pMVar2,&to_schedule,true,true);
  this->total_pipelines =
       (long)to_schedule.
             super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)to_schedule.
             super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(&root_pipeline);
  MetaPipeline::GetPipelines(pMVar2,&this->pipelines,true);
  ScheduleEvents(this,&to_schedule);
  ::std::
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ::~vector(&to_schedule.
             super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root_pipeline.internal.
              super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PipelineBuildState::~PipelineBuildState(&state);
  pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
  return;
}

Assistant:

void Executor::InitializeInternal(PhysicalOperator &plan) {

	auto &scheduler = TaskScheduler::GetScheduler(context);
	{
		lock_guard<mutex> elock(executor_lock);
		physical_plan = &plan;

		this->profiler = ClientData::Get(context).profiler;
		profiler->Initialize(plan);
		this->producer = scheduler.CreateProducer();

		// build and ready the pipelines
		PipelineBuildState state;
		auto root_pipeline = make_shared_ptr<MetaPipeline>(*this, state, nullptr);
		root_pipeline->Build(*physical_plan);
		root_pipeline->Ready();

		// ready recursive cte pipelines too
		for (auto &rec_cte_ref : recursive_ctes) {
			auto &rec_cte = rec_cte_ref.get().Cast<PhysicalRecursiveCTE>();
			rec_cte.recursive_meta_pipeline->Ready();
		}

		// set root pipelines, i.e., all pipelines that end in the final sink
		root_pipeline->GetPipelines(root_pipelines, false);
		root_pipeline_idx = 0;

		// collect all meta-pipelines from the root pipeline
		vector<shared_ptr<MetaPipeline>> to_schedule;
		root_pipeline->GetMetaPipelines(to_schedule, true, true);

		// number of 'PipelineCompleteEvent's is equal to the number of meta pipelines, so we have to set it here
		total_pipelines = to_schedule.size();

		// collect all pipelines from the root pipelines (recursively) for the progress bar and verify them
		root_pipeline->GetPipelines(pipelines, true);

		// finally, verify and schedule
		VerifyPipelines();
		ScheduleEvents(to_schedule);
	}
}